

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O1

Node verona::make_fq(Lookup *lookup,bool fresh)

{
  size_type *psVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TokenDef *pTVar3;
  pointer psVar4;
  element_type *peVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  undefined8 uVar10;
  undefined8 this;
  uint uVar11;
  Token *pTVar12;
  pointer psVar13;
  int iVar14;
  undefined1 *puVar15;
  ulong uVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  pointer psVar18;
  uint in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *__child_stack_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  ulong __val;
  uint uVar20;
  undefined7 in_register_00000031;
  long *plVar21;
  element_type *peVar22;
  undefined8 uVar23;
  void *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Node NVar24;
  Node t;
  Node node;
  Node path;
  undefined1 local_248 [24];
  undefined1 *local_230;
  Token local_228;
  Token local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e8;
  undefined1 local_1e0 [88];
  undefined1 local_188 [24];
  element_type *peStack_170;
  undefined1 local_168 [24];
  element_type *peStack_150;
  undefined1 local_148 [24];
  element_type *peStack_130;
  undefined1 local_128 [24];
  element_type *peStack_110;
  undefined1 local_108 [24];
  element_type *peStack_f0;
  undefined1 local_e8 [24];
  element_type *peStack_d0;
  undefined1 local_c8 [24];
  element_type *peStack_b0;
  Node local_a8;
  element_type *local_98;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_90;
  Node local_88;
  Node local_78;
  Token local_68;
  Token local_60;
  Token local_58;
  WFLookup local_50;
  
  plVar21 = (long *)CONCAT71(in_register_00000031,fresh);
  local_248._0_8_ = Class;
  local_248._8_8_ = TypeAlias;
  local_248._16_8_ = TypeParam;
  local_230 = Trait;
  local_228.def = (TokenDef *)Function;
  pTVar12 = ::std::
            __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                      (local_248,&local_220,*plVar21 + 0x10);
  if (pTVar12 == &local_220) {
    (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar21;
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar21[1];
    (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Var17;
    _Var19._M_pi = extraout_RDX;
    if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
      }
    }
  }
  else {
    local_248._0_8_ = TypePath;
    trieste::NodeDef::create((NodeDef *)local_1e0,(Token *)local_248);
    local_208._24_8_ = *plVar21;
    _Stack_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar21[1];
    if (_Stack_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_1e8._M_pi)->_M_use_count = (_Stack_1e8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_1e8._M_pi)->_M_use_count = (_Stack_1e8._M_pi)->_M_use_count + 1;
      }
    }
    local_1e0._80_8_ = lookup;
    if ((NodeDef *)local_208._24_8_ != (NodeDef *)0x0) {
      puVar15 = (undefined1 *)((ulong)in_EDX & 0xff);
      local_1e0._20_4_ = SUB84(puVar15,0);
      do {
        uVar8 = local_1e0._8_8_;
        uVar23 = local_1e0._0_8_;
        iVar14 = (int)puVar15;
        pTVar3 = ((Token *)(local_208._24_8_ + 0x10))->def;
        if (pTVar3 == (TokenDef *)Class) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
            }
          }
          local_248._0_8_ = TypeClassName;
          trieste::NodeDef::create((NodeDef *)(local_128 + 0x10),(Token *)local_248);
          local_1e0._32_8_ = Ident;
          trieste::operator/((WFLookup *)local_248,(Node *)(local_208 + 0x18),
                             (Token *)(local_1e0 + 0x20));
          uVar7 = local_248._16_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_248._16_8_ + 8) = *(_Atomic_word *)(local_248._16_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_248._16_8_ + 8) = *(_Atomic_word *)(local_248._16_8_ + 8) + 1;
            }
          }
          if ((element_type *)local_248._8_8_ == (element_type *)0x0) {
            local_c8._16_8_ = (TokenDef *)0x0;
            peStack_b0 = (element_type *)0x0;
          }
          else {
            trieste::NodeDef::clone
                      ((NodeDef *)(local_c8 + 0x10),(__fn *)local_248._8_8_,__child_stack,iVar14,
                       in_R8);
          }
          local_218._M_allocated_capacity = local_c8._16_8_;
          local_218._8_8_ = peStack_b0;
          if (peStack_b0 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              psVar1 = &(peStack_b0->origin_)._M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
              UNLOCK();
            }
            else {
              psVar1 = &(peStack_b0->origin_)._M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
            }
          }
          trieste::NodeDef::push_back((NodeDef *)local_128._16_8_,(Node *)&local_218);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
          }
          peVar22 = peStack_110;
          uVar10 = local_128._16_8_;
          local_128._16_8_ = (NodeDef *)0x0;
          peStack_110 = (element_type *)0x0;
          make_typeargs(&local_78,(Lookup *)(local_208 + 0x18),fresh);
          local_218._M_allocated_capacity =
               (size_type)
               local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_218._8_8_ =
               local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
          puVar15 = (undefined1 *)
                    local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          if (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            puVar15 = &__libc_single_threaded;
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count =
                   (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count =
                   (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          trieste::NodeDef::push_back((NodeDef *)uVar10,(Node *)&local_218);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
          }
          local_218._M_allocated_capacity = uVar10;
          local_218._8_8_ = peVar22;
          if (peVar22 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              psVar1 = &(peVar22->origin_)._M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
              UNLOCK();
            }
            else {
              psVar1 = &(peVar22->origin_)._M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
            }
          }
          trieste::NodeDef::push_back((NodeDef *)uVar23,(Node *)&local_218);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
          }
          if (peVar22 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar22);
          }
          if (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (peStack_b0 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_b0);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
          }
          peVar22 = peStack_110;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_);
            peVar22 = peStack_110;
          }
LAB_00157e3b:
          if (peVar22 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar22);
          }
        }
        else {
          iVar14 = 0x2dcd48;
          if (pTVar3 == (TokenDef *)TypeAlias) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
              }
            }
            local_248._0_8_ = &TypeAliasName;
            trieste::NodeDef::create((NodeDef *)local_128,(Token *)local_248);
            local_1e0._32_8_ = Ident;
            trieste::operator/((WFLookup *)local_248,(Node *)(local_208 + 0x18),
                               (Token *)(local_1e0 + 0x20));
            uVar7 = local_248._16_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_248._16_8_ + 8) =
                     *(_Atomic_word *)(local_248._16_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_248._16_8_ + 8) =
                     *(_Atomic_word *)(local_248._16_8_ + 8) + 1;
              }
            }
            if ((element_type *)local_248._8_8_ == (element_type *)0x0) {
              local_c8._0_8_ = (element_type *)0x0;
              local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              trieste::NodeDef::clone
                        ((NodeDef *)local_c8,(__fn *)local_248._8_8_,__child_stack_00,iVar14,in_R8);
            }
            local_218._M_allocated_capacity = local_c8._0_8_;
            local_218._8_8_ = local_c8._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)local_128._0_8_,(Node *)&local_218);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
            }
            this = local_128._8_8_;
            uVar10 = local_128._0_8_;
            local_128._0_8_ = (NodeDef *)0x0;
            local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            make_typeargs(&local_88,(Lookup *)(local_208 + 0x18),fresh);
            local_218._M_allocated_capacity =
                 (size_type)
                 local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_218._8_8_ =
                 local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            puVar15 = (undefined1 *)
                      local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            if ((NodeDef *)
                local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (NodeDef *)0x0) {
              puVar15 = &__libc_single_threaded;
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_88.
                                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count)->_M_pi + 1;
                UNLOCK();
              }
              else {
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_88.
                                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count)->_M_pi + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)uVar10,(Node *)&local_218);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
            }
            local_218._M_allocated_capacity = uVar10;
            local_218._8_8_ = this;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(this + 8) = *(_Atomic_word *)(this + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(this + 8) = *(_Atomic_word *)(this + 8) + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)uVar23,(Node *)&local_218);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
            }
            if ((NodeDef *)
                local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (NodeDef *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_88.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
            }
            peVar22 = (element_type *)local_128._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_);
              peVar22 = (element_type *)local_128._8_8_;
            }
            goto LAB_00157e3b;
          }
          iVar14 = 0x2dcf58;
          if (pTVar3 == (TokenDef *)TypeParam) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
              }
            }
            local_248._0_8_ = TypeParamName;
            trieste::NodeDef::create((NodeDef *)(local_148 + 0x10),(Token *)local_248);
            local_1e0._32_8_ = Ident;
            trieste::operator/((WFLookup *)local_248,(Node *)(local_208 + 0x18),
                               (Token *)(local_1e0 + 0x20));
            uVar7 = local_248._16_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_248._16_8_ + 8) =
                     *(_Atomic_word *)(local_248._16_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_248._16_8_ + 8) =
                     *(_Atomic_word *)(local_248._16_8_ + 8) + 1;
              }
            }
            if ((element_type *)local_248._8_8_ == (element_type *)0x0) {
              local_e8._16_8_ = (element_type *)0x0;
              peStack_d0 = (element_type *)0x0;
            }
            else {
              trieste::NodeDef::clone
                        ((NodeDef *)(local_e8 + 0x10),(__fn *)local_248._8_8_,__child_stack_01,
                         iVar14,in_R8);
            }
            local_218._M_allocated_capacity = local_e8._16_8_;
            local_218._8_8_ = peStack_d0;
            puVar15 = (undefined1 *)local_e8._16_8_;
            if (peStack_d0 != (element_type *)0x0) {
              puVar15 = &__libc_single_threaded;
              if (__libc_single_threaded == '\0') {
                LOCK();
                psVar1 = &(peStack_d0->origin_)._M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
                UNLOCK();
              }
              else {
                psVar1 = &(peStack_d0->origin_)._M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)local_148._16_8_,(Node *)&local_218);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
            }
            peVar22 = peStack_130;
            local_218._M_allocated_capacity = local_148._16_8_;
            local_148._16_8_ = (NodeDef *)0x0;
            peStack_130 = (element_type *)0x0;
            local_218._8_8_ = peVar22;
            if (peVar22 != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                psVar1 = &(peVar22->origin_)._M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
                UNLOCK();
              }
              else {
                psVar1 = &(peVar22->origin_)._M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)uVar23,(Node *)&local_218);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
            }
            if (peVar22 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar22);
            }
            if (peStack_d0 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_d0);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
            }
            peVar22 = peStack_130;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_);
              peVar22 = peStack_130;
            }
            goto LAB_00157e3b;
          }
          iVar14 = 0x2dcec8;
          if (pTVar3 == (TokenDef *)Trait) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
              }
            }
            local_248._0_8_ = TypeTraitName;
            trieste::NodeDef::create((NodeDef *)local_148,(Token *)local_248);
            local_1e0._32_8_ = Ident;
            trieste::operator/((WFLookup *)local_248,(Node *)(local_208 + 0x18),
                               (Token *)(local_1e0 + 0x20));
            uVar7 = local_248._16_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_248._16_8_ + 8) =
                     *(_Atomic_word *)(local_248._16_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_248._16_8_ + 8) =
                     *(_Atomic_word *)(local_248._16_8_ + 8) + 1;
              }
            }
            if ((element_type *)local_248._8_8_ == (element_type *)0x0) {
              local_e8._0_8_ = (element_type *)0x0;
              local_e8._8_8_ = (NodeDef *)0x0;
            }
            else {
              trieste::NodeDef::clone
                        ((NodeDef *)local_e8,(__fn *)local_248._8_8_,__child_stack_02,iVar14,in_R8);
            }
            local_218._M_allocated_capacity = local_e8._0_8_;
            local_218._8_8_ = local_e8._8_8_;
            puVar15 = (undefined1 *)local_e8._0_8_;
            if ((NodeDef *)local_e8._8_8_ != (NodeDef *)0x0) {
              puVar15 = &__libc_single_threaded;
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->_M_pi =
                     *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->
                              _M_pi + 1;
                UNLOCK();
              }
              else {
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->_M_pi =
                     *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->
                              _M_pi + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)local_148._0_8_,(Node *)&local_218);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
            }
            uVar10 = local_148._8_8_;
            local_218._M_allocated_capacity = local_148._0_8_;
            local_148._0_8_ = (NodeDef *)0x0;
            local_148._8_8_ = (element_type *)0x0;
            local_218._8_8_ = uVar10;
            if ((element_type *)uVar10 != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(uVar10 + 8) = (int)*(size_type *)(uVar10 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(uVar10 + 8) = (int)*(size_type *)(uVar10 + 8) + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)uVar23,(Node *)&local_218);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
            }
            if ((element_type *)uVar10 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
            }
            if ((NodeDef *)local_e8._8_8_ != (NodeDef *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
            }
            peVar22 = (element_type *)local_148._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_);
              peVar22 = (element_type *)local_148._8_8_;
            }
            goto LAB_00157e3b;
          }
          puVar15 = Function;
          if (pTVar3 == (TokenDef *)Function) {
            local_1e0._32_8_ = &Params;
            trieste::operator/((WFLookup *)local_248,(Node *)(local_208 + 0x18),
                               (Token *)(local_1e0 + 0x20));
            __val = (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_248._8_8_ + 0x60))
                          ->_vptr__Sp_counted_base -
                    *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (local_248._8_8_ + 0x50))->_M_use_count >> 4;
            uVar20 = 1;
            if (9 < __val) {
              uVar16 = __val;
              uVar11 = 4;
              do {
                uVar20 = uVar11;
                if (uVar16 < 100) {
                  uVar20 = uVar20 - 2;
                  goto LAB_00157eed;
                }
                if (uVar16 < 1000) {
                  uVar20 = uVar20 - 1;
                  goto LAB_00157eed;
                }
                if (uVar16 < 10000) goto LAB_00157eed;
                bVar6 = 99999 < uVar16;
                uVar16 = uVar16 / 10000;
                uVar11 = uVar20 + 4;
              } while (bVar6);
              uVar20 = uVar20 + 1;
            }
LAB_00157eed:
            local_218._M_allocated_capacity = (size_type)local_208;
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_218,(ulong)uVar20,'\0');
            ::std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_218._M_allocated_capacity,local_218._8_4_,__val);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._16_8_);
            }
            uVar23 = local_1e0._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
              }
            }
            local_1e0._72_8_ = local_1e0._8_8_;
            local_248._0_8_ = Selector;
            p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_;
            trieste::NodeDef::create((NodeDef *)(local_168 + 0x10),(Token *)local_248);
            iVar14 = (int)p_Var17;
            local_58.def = (TokenDef *)Ref;
            trieste::operator/((WFLookup *)(local_1e0 + 0x20),(Node *)(local_208 + 0x18),&local_58);
            local_1e0._24_8_ = local_1e0._48_8_;
            if ((element_type *)local_1e0._48_8_ != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                psVar1 = &((string *)local_1e0._48_8_)->_M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
                UNLOCK();
              }
              else {
                psVar1 = &((string *)local_1e0._48_8_)->_M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
              }
            }
            if ((__fn *)local_1e0._40_8_ == (__fn *)0x0) {
              local_108._16_8_ = (TokenDef *)0x0;
              peStack_f0 = (element_type *)0x0;
            }
            else {
              trieste::NodeDef::clone
                        ((NodeDef *)(local_108 + 0x10),(__fn *)local_1e0._40_8_,__child_stack_03,
                         iVar14,in_R8);
            }
            local_248._0_8_ = local_108._16_8_;
            local_248._8_8_ = peStack_f0;
            if (peStack_f0 != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2 = &(peStack_f0->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this
                          .super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
                *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
                UNLOCK();
              }
              else {
                p_Var2 = &(peStack_f0->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this
                          .super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
                *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)local_168._16_8_,(Node *)local_248);
            if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
            }
            peVar5 = peStack_150;
            uVar8 = local_168._16_8_;
            local_168._16_8_ = (NodeDef *)0x0;
            peStack_150 = (element_type *)0x0;
            local_60.def = (TokenDef *)Ident;
            trieste::operator/(&local_50,(Node *)(local_208 + 0x18),&local_60);
            if (local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_1e0._64_8_ =
                 local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if (local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == (element_type *)0x0) {
              local_108._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_108._8_8_ = (element_type *)0x0;
            }
            else {
              trieste::NodeDef::clone
                        ((NodeDef *)local_108,
                         (__fn *)local_50.node.
                                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,__child_stack_04,
                         (int)local_50.node.
                              super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,in_R8);
            }
            local_248._0_8_ = local_108._0_8_;
            local_248._8_8_ = local_108._8_8_;
            if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_108._8_8_ + 8))->_M_pi
                     = *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_108._8_8_ + 8))
                                ->_M_pi + 1;
                UNLOCK();
              }
              else {
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_108._8_8_ + 8))->_M_pi
                     = *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_108._8_8_ + 8))
                                ->_M_pi + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)local_248);
            if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
            }
            local_68.def = (TokenDef *)Int;
            trieste::SourceDef::synthetic((SourceDef *)local_248,(string *)&local_218);
            local_248._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_230 = (undefined1 *)local_218._8_8_;
            trieste::NodeDef::create((NodeDef *)&local_98,&local_68,(Location *)local_248);
            uVar7 = local_1e0._64_8_;
            if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
            }
            local_248._0_8_ = local_98;
            local_248._8_8_ = local_90._M_pi;
            if ((element_type *)local_90._M_pi != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_90._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_90._M_pi)->_M_use_count)->_M_pi + 1;
                UNLOCK();
              }
              else {
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_90._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_90._M_pi)->_M_use_count)->_M_pi + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)local_248);
            if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
            }
            make_typeargs(&local_a8,(Lookup *)(local_208 + 0x18),fresh);
            local_248._0_8_ =
                 local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_248._8_8_ =
                 local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            puVar15 = (undefined1 *)
                      local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            if ((element_type *)
                local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (element_type *)0x0) {
              puVar15 = &__libc_single_threaded;
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_a8.
                                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count)->_M_pi + 1;
                UNLOCK();
              }
              else {
                *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_a8.
                                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count)->_M_pi + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)local_248);
            if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
            }
            local_248._0_8_ = uVar8;
            local_248._8_8_ = peVar5;
            if (peVar5 != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2 = &(peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                          super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
                UNLOCK();
              }
              else {
                p_Var2 = &(peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                          super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
              }
            }
            trieste::NodeDef::push_back((NodeDef *)uVar23,(Node *)local_248);
            if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
            }
            if ((NodeDef *)local_1e0._72_8_ != (NodeDef *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._72_8_);
            }
            if (peVar5 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5);
            }
            uVar23 = local_1e0._24_8_;
            if ((element_type *)
                local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((element_type *)local_90._M_pi != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
            }
            if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
            }
            if (local_50.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_50.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (peStack_f0 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_f0);
            }
            if ((element_type *)uVar23 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23);
            }
            if ((element_type *)local_1e0._48_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._48_8_);
            }
            if (peStack_150 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_150);
            }
            if ((NodeDef *)local_218._M_allocated_capacity != (NodeDef *)local_208) {
              operator_delete((void *)local_218._M_allocated_capacity,
                              (size_t)((long)&(((enable_shared_from_this<trieste::NodeDef> *)
                                               local_208._0_8_)->_M_weak_this).
                                              super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr + 1));
            }
          }
        }
        local_248._0_8_ = Class;
        local_248._8_8_ = TypeAlias;
        local_248._16_8_ = Trait;
        local_230 = Function;
        local_1e0._32_8_ = local_248;
        local_1e0._40_8_ = (__fn *)0x4;
        trieste::NodeDef::parent
                  ((NodeDef *)&local_218,(initializer_list<trieste::Token> *)local_208._24_8_);
        _Var19._M_pi = _Stack_1e8._M_pi;
        _Stack_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
        local_208._24_8_ = local_218._M_allocated_capacity;
        local_218._M_allocated_capacity = 0;
        local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var19._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
        }
      } while ((NodeDef *)local_208._24_8_ != (NodeDef *)0x0);
    }
    psVar13 = (((Nodes *)(local_1e0._0_8_ + 0x58))->
              super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (((Nodes *)(local_1e0._0_8_ + 0x58))->
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    psVar18 = psVar4 + -1;
    if (psVar13 < psVar18 && psVar13 != psVar4) {
      do {
        peVar5 = (psVar13->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (psVar13->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (psVar18->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (psVar18->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar5;
        p_Var17 = (psVar18->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        (psVar18->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
        _M_pi = (psVar13->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        (psVar13->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
        _M_pi = p_Var17;
        psVar13 = psVar13 + 1;
        psVar18 = psVar18 + -1;
      } while (psVar13 < psVar18);
    }
    trieste::NodeDef::pop_back((NodeDef *)local_248);
    _Var19._M_pi = _Stack_1e8._M_pi;
    _Stack_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_;
    local_208._24_8_ = local_248._0_8_;
    local_248._0_8_ = (TokenDef *)0x0;
    local_248._8_8_ = (element_type *)0x0;
    if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var19._M_pi);
    }
    if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
    }
    local_248._0_8_ = TypeClassName;
    local_248._8_8_ = &TypeAliasName;
    local_248._16_8_ = TypeParamName;
    local_230 = TypeTraitName;
    pTVar12 = ::std::
              __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                        (local_248,&local_228,&((string *)local_208._24_8_)->field_2);
    if (pTVar12 == &local_228) {
      if ((((Nodes *)(local_1e0._0_8_ + 0x58))->
          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          )._M_impl.super__Vector_impl_data._M_start ==
          (((Nodes *)(local_1e0._0_8_ + 0x58))->
          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("!path->empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                      ,0x18a,"Node verona::make_fq(Lookup &, bool)");
      }
      trieste::NodeDef::pop_back((NodeDef *)&local_218);
      local_248._0_8_ = FQFunction;
      trieste::NodeDef::create((NodeDef *)(local_188 + 0x10),(Token *)local_248);
      local_248._0_8_ = FQType;
      trieste::NodeDef::create((NodeDef *)local_188,(Token *)local_248);
      uVar23 = local_1e0._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
        }
      }
      local_248._0_8_ = local_1e0._0_8_;
      local_248._8_8_ = local_1e0._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
        }
      }
      trieste::NodeDef::push_back((NodeDef *)local_188._0_8_,(Node *)local_248);
      if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
      }
      uVar10 = local_188._8_8_;
      uVar7 = local_188._0_8_;
      uVar8 = local_218._8_8_;
      local_188._0_8_ = (NodeDef *)0x0;
      local_188._8_8_ = (element_type *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_218._8_8_ + 8) = *(_Atomic_word *)(local_218._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_218._8_8_ + 8) = *(_Atomic_word *)(local_218._8_8_ + 8) + 1;
        }
      }
      local_248._0_8_ = local_218._M_allocated_capacity;
      local_248._8_8_ = local_218._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_218._8_8_ + 8) = *(_Atomic_word *)(local_218._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_218._8_8_ + 8) = *(_Atomic_word *)(local_218._8_8_ + 8) + 1;
        }
      }
      trieste::NodeDef::push_back((NodeDef *)uVar7,(Node *)local_248);
      if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
      }
      local_248._0_8_ = uVar7;
      local_248._8_8_ = uVar10;
      if ((element_type *)uVar10 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(uVar10 + 8))->_M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(uVar10 + 8))->_M_pi + 1;
          UNLOCK();
        }
        else {
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(uVar10 + 8))->_M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(uVar10 + 8))->_M_pi + 1;
        }
      }
      trieste::NodeDef::push_back((NodeDef *)local_188._16_8_,(Node *)local_248);
      if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
      }
      peVar22 = peStack_170;
      uVar7 = local_188._16_8_;
      _Var9._M_pi = _Stack_1e8._M_pi;
      local_188._16_8_ = (NodeDef *)0x0;
      peStack_170 = (element_type *)0x0;
      if ((element_type *)_Stack_1e8._M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1e8._M_pi)->_M_use_count)->
                   _M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                        &(_Stack_1e8._M_pi)->_M_use_count)->_M_pi + 1;
          UNLOCK();
        }
        else {
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1e8._M_pi)->_M_use_count)->
                   _M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                        &(_Stack_1e8._M_pi)->_M_use_count)->_M_pi + 1;
        }
      }
      local_248._0_8_ = local_208._24_8_;
      local_248._8_8_ = _Stack_1e8._M_pi;
      if ((element_type *)_Stack_1e8._M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1e8._M_pi)->_M_use_count)->
                   _M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                        &(_Stack_1e8._M_pi)->_M_use_count)->_M_pi + 1;
          UNLOCK();
        }
        else {
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1e8._M_pi)->_M_use_count)->
                   _M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                        &(_Stack_1e8._M_pi)->_M_use_count)->_M_pi + 1;
        }
      }
      trieste::NodeDef::push_back((NodeDef *)uVar7,(Node *)local_248);
      _Var19._M_pi = extraout_RDX_04;
      if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
        _Var19._M_pi = extraout_RDX_05;
      }
      ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
      &((enable_shared_from_this<trieste::NodeDef> *)local_1e0._80_8_)->_M_weak_this)->_M_ptr =
           (element_type *)uVar7;
      (((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
       &((enable_shared_from_this<trieste::NodeDef> *)local_1e0._80_8_)->_M_weak_this)->_M_refcount)
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar22;
      if ((element_type *)_Var9._M_pi != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
        _Var19._M_pi = extraout_RDX_06;
      }
      if ((element_type *)uVar10 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
        _Var19._M_pi = extraout_RDX_07;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
        _Var19._M_pi = extraout_RDX_08;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23);
        _Var19._M_pi = extraout_RDX_09;
      }
      lookup = (Lookup *)local_1e0._80_8_;
      if ((element_type *)local_188._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
        _Var19._M_pi = extraout_RDX_10;
      }
      uVar23 = local_218._8_8_;
      if (peStack_170 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_170);
        _Var19._M_pi = extraout_RDX_11;
        uVar23 = local_218._8_8_;
      }
    }
    else {
      local_248._0_8_ = FQType;
      trieste::NodeDef::create((NodeDef *)local_168,(Token *)local_248);
      uVar8 = local_1e0._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
        }
      }
      local_248._0_8_ = local_1e0._0_8_;
      local_248._8_8_ = local_1e0._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_1e0._8_8_ + 8) = *(_Atomic_word *)(local_1e0._8_8_ + 8) + 1;
        }
      }
      trieste::NodeDef::push_back((NodeDef *)local_168._0_8_,(Node *)local_248);
      if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
      }
      uVar7 = local_168._8_8_;
      uVar23 = local_168._0_8_;
      _Var9._M_pi = _Stack_1e8._M_pi;
      local_168._0_8_ = (NodeDef *)0x0;
      local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((element_type *)_Stack_1e8._M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1e8._M_pi)->_M_use_count)->
                   _M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                        &(_Stack_1e8._M_pi)->_M_use_count)->_M_pi + 1;
          UNLOCK();
        }
        else {
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1e8._M_pi)->_M_use_count)->
                   _M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                        &(_Stack_1e8._M_pi)->_M_use_count)->_M_pi + 1;
        }
      }
      local_248._0_8_ = local_208._24_8_;
      local_248._8_8_ = _Stack_1e8._M_pi;
      if ((element_type *)_Stack_1e8._M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1e8._M_pi)->_M_use_count)->
                   _M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                        &(_Stack_1e8._M_pi)->_M_use_count)->_M_pi + 1;
          UNLOCK();
        }
        else {
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1e8._M_pi)->_M_use_count)->
                   _M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                        &(_Stack_1e8._M_pi)->_M_use_count)->_M_pi + 1;
        }
      }
      trieste::NodeDef::push_back((NodeDef *)uVar23,(Node *)local_248);
      _Var19._M_pi = extraout_RDX_00;
      if ((element_type *)local_248._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
        _Var19._M_pi = extraout_RDX_01;
      }
      lookup = (Lookup *)local_1e0._80_8_;
      ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
      &((enable_shared_from_this<trieste::NodeDef> *)local_1e0._80_8_)->_M_weak_this)->_M_ptr =
           (element_type *)uVar23;
      (((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
       &((enable_shared_from_this<trieste::NodeDef> *)local_1e0._80_8_)->_M_weak_this)->_M_refcount)
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
      if ((element_type *)_Var9._M_pi != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
        _Var19._M_pi = extraout_RDX_02;
      }
      uVar23 = local_168._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
        _Var19._M_pi = extraout_RDX_03;
        uVar23 = local_168._8_8_;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23);
      _Var19._M_pi = extraout_RDX_12;
    }
    if ((element_type *)_Stack_1e8._M_pi != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e8._M_pi);
      _Var19._M_pi = extraout_RDX_13;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_);
      _Var19._M_pi = extraout_RDX_14;
    }
  }
  NVar24.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var19._M_pi;
  NVar24.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)lookup;
  return (Node)NVar24.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Node make_fq(Lookup& lookup, bool fresh)
  {
    if (!lookup.def->in({Class, TypeAlias, TypeParam, Trait, Function}))
      return lookup.def;

    Node path = TypePath;
    auto node = lookup.def;

    while (node)
    {
      if (node == Class)
      {
        path
          << (TypeClassName << clone(node / Ident)
                            << make_typeargs(node, lookup, fresh));
      }
      else if (node == TypeAlias)
      {
        path
          << (TypeAliasName << clone(node / Ident)
                            << make_typeargs(node, lookup, fresh));
      }
      else if (node == TypeParam)
      {
        path << (TypeParamName << clone(node / Ident));
      }
      else if (node == Trait)
      {
        path << (TypeTraitName << clone(node / Ident));
      }
      else if (node == Function)
      {
        auto arity = std::to_string((node / Params)->size());

        path
          << (Selector << clone(node / Ref) << clone(node / Ident)
                       << (Int ^ arity) << make_typeargs(node, lookup, fresh));
      }

      node = node->parent({Class, TypeAlias, Trait, Function});
    }

    std::reverse(path->begin(), path->end());
    node = path->pop_back();

    if (node->in({TypeClassName, TypeAliasName, TypeParamName, TypeTraitName}))
      return FQType << path << node;

    assert(!path->empty());
    auto t = path->pop_back();
    return FQFunction << (FQType << path << t) << node;
  }